

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_init(MppDecVprocCtx *ctx,MppDecVprocCfg *cfg)

{
  MPP_RET MVar1;
  MppThread *pMVar2;
  iep_com_ctx *piVar3;
  long *local_30;
  MppDecVprocCtxImpl *p;
  MPP_RET ret;
  MppDecVprocCfg *cfg_local;
  MppDecVprocCtx *ctx_local;
  
  if (((ctx == (MppDecVprocCtx *)0x0) || (cfg == (MppDecVprocCfg *)0x0)) ||
     (cfg->mpp == (void *)0x0)) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL input ctx %p mpp %p\n","dec_vproc_init",ctx,cfg->mpp);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vproc_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","in\n","dec_vproc_init");
    }
    mpp_env_get_u32("vproc_debug",&vproc_debug,0);
    *ctx = (MppDecVprocCtx)0x0;
    local_30 = (long *)mpp_osal_calloc("dec_vproc_init",0xe8);
    if (local_30 == (long *)0x0) {
      _mpp_log_l(2,"mpp_dec_vproc","malloc failed\n","dec_vproc_init");
      ctx_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      *(undefined4 *)(local_30 + 0x16) = 2;
      *local_30 = (long)cfg->mpp;
      local_30[2] = *(long *)(*(long *)(*local_30 + 0xa8) + 0x30);
      pMVar2 = (MppThread *)operator_new(0x198);
      MppThread::MppThread(pMVar2,dec_vproc_thread,local_30,"mpp_dec_vproc");
      local_30[3] = (long)pMVar2;
      sem_init((sem_t *)(local_30 + 5),0,0);
      MVar1 = hal_task_group_init((HalTaskGroup *)(local_30 + 1),3,4,8);
      if (MVar1 == MPP_OK) {
        cfg->task_group = (HalTaskGroup)local_30[1];
        piVar3 = get_iep_ctx();
        local_30[10] = (long)piVar3;
        if (local_30[10] == 0) {
          _mpp_log_l(2,"mpp_dec_vproc","failed to require context\n",(char *)0x0);
          pMVar2 = (MppThread *)local_30[3];
          if (pMVar2 != (MppThread *)0x0) {
            MppThread::~MppThread(pMVar2);
            operator_delete(pMVar2,0x198);
          }
          if (local_30[1] != 0) {
            hal_task_group_deinit((HalTaskGroup)local_30[1]);
            local_30[1] = 0;
          }
          if (local_30 != (long *)0x0) {
            mpp_osal_free("dec_vproc_init",local_30);
          }
          ctx_local._4_4_ = MPP_ERR_MALLOC;
        }
        else {
          if (*(int *)(local_30[10] + 0x10) == 1) {
            local_30[0x1b] = (long)dec_vproc_start_dei_v1;
            local_30[0x1a] = (long)dec_vproc_set_dei_v1;
            local_30[0x1c] = (long)dec_vproc_update_ref_v1;
          }
          else {
            local_30[0x1b] = (long)dec_vproc_start_dei_v2;
            local_30[0x1a] = (long)dec_vproc_set_dei_v2;
            local_30[0x1c] = (long)dec_vproc_update_ref_v2;
          }
          ctx_local._4_4_ = (*(code *)**(undefined8 **)local_30[10])(local_30[10] + 8);
          local_30[9] = *(long *)(local_30[10] + 8);
          if ((local_30[3] == 0) || (ctx_local._4_4_ != MPP_OK)) {
            _mpp_log_l(2,"mpp_dec_vproc","failed to create context\n",(char *)0x0);
            if (local_30[3] != 0) {
              pMVar2 = (MppThread *)local_30[3];
              if (pMVar2 != (MppThread *)0x0) {
                MppThread::~MppThread(pMVar2);
                operator_delete(pMVar2,0x198);
              }
              local_30[3] = 0;
            }
            if (local_30[9] != 0) {
              (**(code **)(*(long *)local_30[10] + 8))(local_30[9]);
            }
            if (local_30[1] != 0) {
              hal_task_group_deinit((HalTaskGroup)local_30[1]);
              local_30[1] = 0;
            }
            put_iep_ctx((iep_com_ctx *)local_30[10]);
            if (local_30 != (long *)0x0) {
              mpp_osal_free("dec_vproc_init",local_30);
            }
            local_30 = (long *)0x0;
          }
          else {
            *(undefined4 *)(local_30 + 0xb) = 1;
            *(undefined4 *)((long)local_30 + 0x5c) = 1;
            *(undefined4 *)(local_30 + 0xc) = 0;
            *(undefined4 *)((long)local_30 + 100) = 0x40;
            *(undefined4 *)(local_30 + 0xd) = 0;
            *(undefined4 *)((long)local_30 + 0x6c) = 1;
            *(undefined4 *)(local_30 + 0xe) = 0;
            *(undefined4 *)((long)local_30 + 0x74) = 2;
            *(undefined4 *)((long)local_30 + 0x94) = 0xffffffff;
            local_30[0x13] = 0;
            *(undefined4 *)(local_30 + 0x14) = 0xffffffff;
            local_30[0x15] = 0;
          }
          *ctx = local_30;
          if ((vproc_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","out\n","dec_vproc_init");
          }
        }
      }
      else {
        _mpp_log_l(2,"mpp_dec_vproc","create task group failed\n","dec_vproc_init");
        pMVar2 = (MppThread *)local_30[3];
        if (pMVar2 != (MppThread *)0x0) {
          MppThread::~MppThread(pMVar2);
          operator_delete(pMVar2,0x198);
        }
        if (local_30 != (long *)0x0) {
          mpp_osal_free("dec_vproc_init",local_30);
        }
        ctx_local._4_4_ = MPP_ERR_MALLOC;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET dec_vproc_init(MppDecVprocCtx *ctx, MppDecVprocCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    if (NULL == ctx || NULL == cfg || NULL == cfg->mpp) {
        mpp_err_f("found NULL input ctx %p mpp %p\n", ctx, cfg->mpp);
        return MPP_ERR_NULL_PTR;
    }

    vproc_dbg_func("in\n");
    mpp_env_get_u32("vproc_debug", &vproc_debug, 0);

    *ctx = NULL;

    MppDecVprocCtxImpl *p = mpp_calloc(MppDecVprocCtxImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    p->pre_ff_mode = IEP2_FF_MODE_UND;
    p->mpp = (Mpp *)cfg->mpp;
    p->slots = ((MppDecImpl *)p->mpp->mDec)->frame_slots;
    p->thd = new MppThread(dec_vproc_thread, p, "mpp_dec_vproc");
    sem_init(&p->reset_sem, 0, 0);
    ret = hal_task_group_init(&p->task_group, TASK_BUTT, 4, sizeof(HalDecVprocTask));
    if (ret) {
        mpp_err_f("create task group failed\n");
        delete p->thd;
        MPP_FREE(p);
        return MPP_ERR_MALLOC;
    }
    cfg->task_group = p->task_group;

    p->com_ctx = get_iep_ctx();
    if (!p->com_ctx) {
        mpp_err("failed to require context\n");
        delete p->thd;

        if (p->task_group) {
            hal_task_group_deinit(p->task_group);
            p->task_group = NULL;
        }

        MPP_FREE(p);

        return MPP_ERR_MALLOC;
    }

    if (p->com_ctx->ver == 1) {
        p->start_dei = dec_vproc_start_dei_v1;
        p->set_dei = dec_vproc_set_dei_v1;
        p->update_ref = dec_vproc_update_ref_v1;
    } else {
        p->start_dei = dec_vproc_start_dei_v2;
        p->set_dei = dec_vproc_set_dei_v2;
        p->update_ref = dec_vproc_update_ref_v2;
    }

    ret = p->com_ctx->ops->init(&p->com_ctx->priv);
    p->iep_ctx = p->com_ctx->priv;
    if (!p->thd || ret) {
        mpp_err("failed to create context\n");
        if (p->thd) {
            delete p->thd;
            p->thd = NULL;
        }

        if (p->iep_ctx)
            p->com_ctx->ops->deinit(p->iep_ctx);

        if (p->task_group) {
            hal_task_group_deinit(p->task_group);
            p->task_group = NULL;
        }

        put_iep_ctx(p->com_ctx);

        MPP_FREE(p);
    } else {
        p->dei_cfg.dei_mode = IEP_DEI_MODE_I2O1;
        p->dei_cfg.dei_field_order = IEP_DEI_FLD_ORDER_BOT_FIRST;
        /*
         * We need to turn off this switch to prevent some areas
         * of the video from flickering.
         */
        p->dei_cfg.dei_high_freq_en = 0;
        p->dei_cfg.dei_high_freq_fct = 64;
        p->dei_cfg.dei_ei_mode = 0;
        p->dei_cfg.dei_ei_smooth = 1;
        p->dei_cfg.dei_ei_sel = 0;
        p->dei_cfg.dei_ei_radius = 2;

        p->prev_idx0 = -1;
        p->prev_frm0 = NULL;
        p->prev_idx1 = -1;
        p->prev_frm1 = NULL;
    }

    *ctx = p;

    vproc_dbg_func("out\n");
    return ret;
}